

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.h
# Opt level: O2

bool __thiscall S2Polygon::OwningShape::Init(OwningShape *this,Decoder *decoder)

{
  _Head_base<0UL,_S2Polygon_*,_false> __p;
  bool bVar1;
  S2Polygon *in_RAX;
  scalar polygon;
  _Head_base<0UL,_S2Polygon_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  absl::make_unique<S2Polygon>();
  bVar1 = Decode(local_28._M_head_impl,decoder);
  if (bVar1) {
    Shape::Init(&this->super_Shape,local_28._M_head_impl);
    __p._M_head_impl = local_28._M_head_impl;
    local_28._M_head_impl = (S2Polygon *)0x0;
    std::__uniq_ptr_impl<const_S2Polygon,_std::default_delete<const_S2Polygon>_>::reset
              ((__uniq_ptr_impl<const_S2Polygon,_std::default_delete<const_S2Polygon>_> *)
               &this->owned_polygon_,__p._M_head_impl);
  }
  std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::~unique_ptr
            ((unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *)&local_28);
  return bVar1;
}

Assistant:

bool Init(Decoder* decoder) {
      auto polygon = absl::make_unique<S2Polygon>();
      if (!polygon->Decode(decoder)) return false;
      Shape::Init(polygon.get());
      owned_polygon_ = std::move(polygon);
      return true;
    }